

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprSwitch * AnalyzeSwitch(ExpressionContext *ctx,SynSwitch *syntax)

{
  IntrusiveList<ExprBase> blocks_00;
  IntrusiveList<ExprBase> cases_00;
  IntrusiveList<ExprBase> expressions_00;
  bool bVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  ExprBase *pEVar4;
  VariableHandle *this;
  SynBase *source;
  ExprBase *rhs;
  SynSwitchCase *this_00;
  ExprSwitch *this_01;
  ExprBase *block;
  SynBase *expression;
  IntrusiveList<ExprBase> expressions;
  ExprBase *conditionValue;
  ExprBase *caseValue;
  SynSwitchCase *curr;
  ExprBase *defaultBlock;
  IntrusiveList<ExprBase> blocks;
  IntrusiveList<ExprBase> cases;
  ExprBase *initializer;
  ExprBase *access;
  VariableData *conditionVariable;
  ExprBase *condition;
  SynSwitch *syntax_local;
  ExpressionContext *ctx_local;
  
  ExpressionContext::PushLoopScope(ctx,true,false);
  conditionVariable = (VariableData *)AnalyzeExpression(ctx,syntax->condition);
  if (*(TypeBase **)&conditionVariable->alignment == ctx->typeVoid) {
    anon_unknown.dwarf_6f1cc::Report
              (ctx,syntax->condition,"ERROR: condition type cannot be \'%.*s\'",
               (ulong)(uint)((int)((*(TypeBase **)&conditionVariable->alignment)->name).end -
                            (int)((*(TypeBase **)&conditionVariable->alignment)->name).begin),
               ((*(TypeBase **)&conditionVariable->alignment)->name).begin);
  }
  access = (ExprBase *)0x0;
  bVar1 = isType<TypeError>(*(TypeBase **)&conditionVariable->alignment);
  if (!bVar1) {
    bVar1 = AssertValueExpression(ctx,syntax->condition,(ExprBase *)conditionVariable);
    if (bVar1) {
      pSVar2 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      access = (ExprBase *)
               anon_unknown.dwarf_6f1cc::AllocateTemporary
                         (ctx,pSVar2,*(TypeBase **)&conditionVariable->alignment);
    }
    else {
      pSVar2 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      access = (ExprBase *)anon_unknown.dwarf_6f1cc::AllocateTemporary(ctx,pSVar2,pTVar3);
    }
    pSVar2 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    pEVar4 = CreateVariableAccess(ctx,pSVar2,(VariableData *)access,false);
    pEVar4 = CreateAssignment(ctx,syntax->condition,pEVar4,(ExprBase *)conditionVariable);
    conditionVariable = (VariableData *)ExpressionContext::get<ExprVariableDefinition>(ctx);
    pSVar2 = syntax->condition;
    pTVar3 = ctx->typeVoid;
    this = ExpressionContext::get<VariableHandle>(ctx);
    VariableHandle::VariableHandle(this,(SynBase *)0x0,(VariableData *)access);
    ExprVariableDefinition::ExprVariableDefinition
              ((ExprVariableDefinition *)conditionVariable,pSVar2,pTVar3,this,pEVar4);
  }
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&blocks.tail);
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&defaultBlock);
  curr = (SynSwitchCase *)0x0;
  for (caseValue = (ExprBase *)(syntax->cases).head; caseValue != (ExprBase *)0x0;
      caseValue = (ExprBase *)getType<SynSwitchCase>((SynBase *)caseValue[1]._vptr_ExprBase)) {
    if (caseValue[1].source != (SynBase *)0x0) {
      pEVar4 = AnalyzeExpression(ctx,caseValue[1].source);
      bVar1 = isType<TypeError>(pEVar4->type);
      if ((bVar1) || (bVar1 = isType<TypeError>(*(TypeBase **)&conditionVariable->alignment), bVar1)
         ) {
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&blocks.tail,pEVar4);
      }
      else {
        if (pEVar4->type == ctx->typeVoid) {
          anon_unknown.dwarf_6f1cc::Report
                    (ctx,syntax->condition,"ERROR: case value type cannot be \'%.*s\'",
                     (ulong)(uint)((int)(pEVar4->type->name).end - (int)(pEVar4->type->name).begin),
                     (pEVar4->type->name).begin);
        }
        pSVar2 = caseValue[1].source;
        source = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
        rhs = CreateVariableAccess(ctx,source,(VariableData *)access,false);
        expressions.tail = CreateBinaryOp(ctx,pSVar2,SYN_BINARY_OP_EQUAL,pEVar4,rhs);
        bVar1 = ExpressionContext::IsIntegerType(ctx,(expressions.tail)->type);
        if ((!bVar1) || ((expressions.tail)->type == ctx->typeLong)) {
          anon_unknown.dwarf_6f1cc::Report
                    (ctx,(SynBase *)caseValue,
                     "ERROR: \'==\' operator result type must be bool, char, short or int");
        }
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&blocks.tail,expressions.tail)
        ;
      }
    }
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&expression);
    for (block = (ExprBase *)caseValue[1].type; block != (ExprBase *)0x0;
        block = (ExprBase *)block[1]._vptr_ExprBase) {
      pEVar4 = AnalyzeStatement(ctx,(SynBase *)block);
      IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&expression,pEVar4);
    }
    this_00 = (SynSwitchCase *)ExpressionContext::get<ExprBlock>(ctx);
    pSVar2 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    expressions_00.tail = expressions.head;
    expressions_00.head = (ExprBase *)expression;
    ExprBlock::ExprBlock((ExprBlock *)this_00,pSVar2,ctx->typeVoid,expressions_00,(ExprBase *)0x0);
    if (caseValue[1].source != (SynBase *)0x0) {
      IntrusiveList<ExprBase>::push_back
                ((IntrusiveList<ExprBase> *)&defaultBlock,(ExprBase *)this_00);
      this_00 = curr;
    }
    curr = this_00;
  }
  ExpressionContext::PopScope(ctx,SCOPE_LOOP);
  this_01 = ExpressionContext::get<ExprSwitch>(ctx);
  cases_00.tail = cases.head;
  cases_00.head = blocks.tail;
  blocks_00.tail = blocks.head;
  blocks_00.head = defaultBlock;
  ExprSwitch::ExprSwitch
            (this_01,&syntax->super_SynBase,ctx->typeVoid,(ExprBase *)conditionVariable,cases_00,
             blocks_00,(ExprBase *)curr);
  return this_01;
}

Assistant:

ExprSwitch* AnalyzeSwitch(ExpressionContext &ctx, SynSwitch *syntax)
{
	ctx.PushLoopScope(true, false);

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	if(condition->type == ctx.typeVoid)
		Report(ctx, syntax->condition, "ERROR: condition type cannot be '%.*s'", FMT_ISTR(condition->type->name));

	VariableData *conditionVariable = NULL;
	
	if(!isType<TypeError>(condition->type))
	{
		if(!AssertValueExpression(ctx, syntax->condition, condition))
			conditionVariable = AllocateTemporary(ctx, ctx.MakeInternal(syntax), ctx.GetErrorType());
		else
			conditionVariable = AllocateTemporary(ctx, ctx.MakeInternal(syntax), condition->type);

		ExprBase *access = CreateVariableAccess(ctx, ctx.MakeInternal(syntax), conditionVariable, false);

		ExprBase *initializer = CreateAssignment(ctx, syntax->condition, access, condition);

		condition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax->condition, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, conditionVariable), initializer);
	}

	IntrusiveList<ExprBase> cases;
	IntrusiveList<ExprBase> blocks;
	ExprBase *defaultBlock = NULL;

	for(SynSwitchCase *curr = syntax->cases.head; curr; curr = getType<SynSwitchCase>(curr->next))
	{
		if(curr->value)
		{
			ExprBase *caseValue = AnalyzeExpression(ctx, curr->value);

			if(isType<TypeError>(caseValue->type) || isType<TypeError>(condition->type))
			{
				cases.push_back(caseValue);
			}
			else
			{
				if(caseValue->type == ctx.typeVoid)
					Report(ctx, syntax->condition, "ERROR: case value type cannot be '%.*s'", FMT_ISTR(caseValue->type->name));

				ExprBase *conditionValue = CreateBinaryOp(ctx, curr->value, SYN_BINARY_OP_EQUAL, caseValue, CreateVariableAccess(ctx, ctx.MakeInternal(syntax), conditionVariable, false));

				if(!ctx.IsIntegerType(conditionValue->type) || conditionValue->type == ctx.typeLong)
					Report(ctx, curr, "ERROR: '==' operator result type must be bool, char, short or int");

				cases.push_back(conditionValue);
			}
		}

		IntrusiveList<ExprBase> expressions;

		for(SynBase *expression = curr->expressions.head; expression; expression = expression->next)
			expressions.push_back(AnalyzeStatement(ctx, expression));

		ExprBase *block = new (ctx.get<ExprBlock>()) ExprBlock(ctx.MakeInternal(syntax), ctx.typeVoid, expressions, NULL);

		if(curr->value)
			blocks.push_back(block);
		else
			defaultBlock = block;
	}

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprSwitch>()) ExprSwitch(syntax, ctx.typeVoid, condition, cases, blocks, defaultBlock);
}